

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_Writer::Write_Permutations_(OSTEI_Writer *this)

{
  QAM am;
  undefined1 local_a0 [48];
  undefined1 local_70 [48];
  undefined1 local_40 [48];
  
  QAM::QAM(&am,&(((this->super_OSTEI_Writer_Base).info_)->super_GeneratorInfoBase).finalam_);
  QAM::QAM((QAM *)local_40,&am);
  Write_Permute_(this,(QAM *)local_40,true,false);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  QAM::QAM((QAM *)local_70,&am);
  Write_Permute_(this,(QAM *)local_70,false,true);
  std::__cxx11::string::~string((string *)(local_70 + 0x10));
  QAM::QAM((QAM *)local_a0,&am);
  Write_Permute_(this,(QAM *)local_a0,true,true);
  std::__cxx11::string::~string((string *)(local_a0 + 0x10));
  std::__cxx11::string::~string((string *)&am.tag);
  return;
}

Assistant:

void OSTEI_Writer::Write_Permutations_(void) const
{
    ///////////////////////////////////////////////////////////
    // Note that we never permute bra, ket. That would
    // affect vectorization since we only vectorize on the ket
    ///////////////////////////////////////////////////////////
    QAM am = info_.FinalAM();

    // permute 1,2
    Write_Permute_(am, true, false);

    // permute 3,4
    Write_Permute_(am, false, true);

    // permute 1,2 and 3,4
    Write_Permute_(am, true, true);
}